

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht.c
# Opt level: O0

void lgx_ht_cleanup(lgx_ht_t *ht)

{
  lgx_ht_node_s *plVar1;
  lgx_ht_node_t *next;
  lgx_ht_node_t *node;
  int i;
  lgx_ht_t *ht_local;
  
  for (node._4_4_ = 0; node._4_4_ < ht->size; node._4_4_ = node._4_4_ + 1) {
    next = ht->table[(int)node._4_4_];
    while (next != (lgx_ht_node_t *)0x0) {
      plVar1 = next->next;
      ht_node_del(next);
      next = plVar1;
    }
  }
  free(ht->table);
  memset(ht,0,0x20);
  return;
}

Assistant:

void lgx_ht_cleanup(lgx_ht_t* ht) {
    int i;
    lgx_ht_node_t *node, *next;
    for (i = 0; i < ht->size; i++) {
        node = ht->table[i];
        while (node) {
            next = node->next;
            ht_node_del(node);
            node = next;
        }
    }

    xfree(ht->table);

    memset(ht, 0, sizeof(lgx_ht_t));
}